

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__profile_GLES__technique__pass__light_position
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  xmlChar **ppxVar1;
  ParserChar *buffer;
  undefined8 uVar2;
  bool bVar3;
  uint *puVar4;
  code *pcVar5;
  uint64 uVar6;
  uint uVar7;
  xmlChar *text;
  bool failed;
  bool local_39;
  XSList<float> *local_38;
  
  puVar4 = (uint *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x28);
  uVar2 = profile_GLES__technique__pass__light_position__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)puVar4 =
       profile_GLES__technique__pass__light_position__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(puVar4 + 2) = uVar2;
  uVar2 = profile_GLES__technique__pass__light_position__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(puVar4 + 4) =
       profile_GLES__technique__pass__light_position__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(puVar4 + 6) = uVar2;
  *(undefined8 *)(puVar4 + 8) =
       profile_GLES__technique__pass__light_position__AttributeData::DEFAULT._32_8_;
  *attributeDataPtr = puVar4;
  ppxVar1 = attributes->attributes;
  if ((ppxVar1 != (xmlChar **)0x0) && (text = *ppxVar1, text != (xmlChar *)0x0)) {
    local_38 = (XSList<float> *)(puVar4 + 2);
    do {
      pcVar5 = (code *)GeneratedSaxParser::Utils::calculateStringHash(text);
      buffer = ppxVar1[1];
      if (pcVar5 == COLLADASaxFWL15::ColladaParserAutoGen15Private::_end__render__instance_material)
      {
        uVar6 = GeneratedSaxParser::Utils::toUint64(buffer,&local_39);
        *(uint64 *)(puVar4 + 8) = uVar6;
        if ((local_39 == true) &&
           (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x95f0f0e,0x704ac8,buffer), bVar3)) {
          return false;
        }
        if ((local_39 & 1U) == 0) {
          *(byte *)puVar4 = (byte)*puVar4 | 2;
        }
      }
      else if (pcVar5 == (code *)0x76887d) {
        *(ParserChar **)(puVar4 + 6) = buffer;
      }
      else {
        if (pcVar5 == (code *)0x7c83b5) {
          bVar3 = GeneratedSaxParser::
                  ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                  ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                            (&this->
                              super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                             ,buffer,local_38);
          if (bVar3) {
            *(byte *)puVar4 = (byte)*puVar4 | 1;
            goto LAB_0069ed2c;
          }
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x95f0f0e,0x7c83b5,buffer);
        }
        else {
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x95f0f0e,text,buffer);
        }
        if (bVar3 != false) {
          return false;
        }
      }
LAB_0069ed2c:
      text = ppxVar1[2];
      ppxVar1 = ppxVar1 + 2;
    } while (text != (xmlChar *)0x0);
  }
  uVar7 = *puVar4;
  if ((uVar7 & 1) == 0) {
    bVar3 = GeneratedSaxParser::
            ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
            ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                      (&this->
                        super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ,"0.0E1 0.0E1 1.0E0 0.0E1",(XSList<float> *)(puVar4 + 2));
    uVar7 = *puVar4;
    if (bVar3) {
      uVar7 = uVar7 | 1;
      *puVar4 = uVar7;
    }
  }
  if (((uVar7 & 2) == 0) &&
     (bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x95f0f0e,0x704ac8,(ParserChar *)0x0),
     bVar3)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__light_position( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__light_position( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__light_position__AttributeData* attributeData = newData<profile_GLES__technique__pass__light_position__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_LIGHT_POSITION, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHT_POSITION,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_POSITION,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__light_position__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_POSITION,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_LIGHT_POSITION,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__GLES_MAX_LIGHTS_index(attributeData->index);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_LIGHT_POSITION,
            HASH_ATTRIBUTE_index,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif
if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__light_position__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_LIGHT_POSITION, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__light_position__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    bool failed;
    failed = !characterData2FloatList("0.0E1 0.0E1 1.0E0 0.0E1", attributeData->value);
    if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__light_position__AttributeData::ATTRIBUTE_VALUE_PRESENT;
}
if ( (attributeData->present_attributes & profile_GLES__technique__pass__light_position__AttributeData::ATTRIBUTE_INDEX_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_LIGHT_POSITION, HASH_ATTRIBUTE_index, 0 ) )
        return false;
}


    return true;
}